

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

char * path_elem(char *path,char *buff,char *sep)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    cVar1 = *path;
    if (cVar1 == '\0') {
      if (lVar4 == 0) {
        path = (char *)0x0;
      }
      else {
        buff[lVar4] = '\0';
      }
      return path;
    }
    _ecs_assert(lVar4 < 0x40,2,(char *)0x0,"bptr - buff < ECS_MAX_NAME_LENGTH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                ,0xf1);
    if (0x3f < lVar4) break;
    sVar3 = strlen(sep);
    iVar2 = strncmp(path,sep,(long)(int)sVar3);
    if (iVar2 == 0) {
      buff[lVar4] = '\0';
      return path + ((long)((sVar3 << 0x20) + -0x100000000) >> 0x20) + 1;
    }
    buff[lVar4] = cVar1;
    path = path + 1;
    lVar4 = lVar4 + 1;
  }
  __assert_fail("bptr - buff < (64)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                ,0xf1,"const char *path_elem(const char *, char *, const char *)");
}

Assistant:

static
const char *path_elem(
    const char *path,
    char *buff,
    const char *sep)
{
    const char *ptr;
    char *bptr, ch;

    for (bptr = buff, ptr = path; (ch = *ptr); ptr ++) {
        ecs_assert(bptr - buff < ECS_MAX_NAME_LENGTH, ECS_INVALID_PARAMETER, 
            NULL);
            
        if (is_sep(&ptr, sep)) {
            *bptr = '\0';
            return ptr + 1;
        } else {
            *bptr = ch;
            bptr ++;
        }
    }

    if (bptr != buff) {
        *bptr = '\0';
        return ptr;
    } else {
        return NULL;
    }
}